

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t HUF_decompress4X1_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int flags)

{
  size_t sVar1;
  void *in_R8;
  uint in_R9D;
  size_t ret;
  HUF_DecompressFastLoopFn loopFn;
  HUF_DecompressUsingDTableFn fallbackFn;
  HUF_DecompressFastLoopFn in_stack_000000b0;
  HUF_DTable *in_stack_000000b8;
  size_t in_stack_000000c0;
  void *in_stack_000000c8;
  size_t in_stack_000000d0;
  void *in_stack_000000d8;
  HUF_DTable *in_stack_ffffffffffffffb0;
  code *cSrcSize_00;
  code *cSrc_00;
  undefined4 in_stack_ffffffffffffffc8;
  size_t local_8;
  
  cSrcSize_00 = HUF_decompress4X1_usingDTable_internal_fast_c_loop;
  if ((in_R9D & 1) == 0) {
    local_8 = HUF_decompress4X1_usingDTable_internal_default
                        (in_R8,CONCAT44(in_R9D,in_stack_ffffffffffffffc8),
                         HUF_decompress4X1_usingDTable_internal_default,0x3a9330,
                         in_stack_ffffffffffffffb0);
  }
  else {
    cSrc_00 = HUF_decompress4X1_usingDTable_internal_bmi2;
    if ((in_R9D & 0x20) == 0) {
      sVar1 = HUF_decompress4X1_usingDTable_internal_fast
                        (in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,
                         in_stack_000000b8,in_stack_000000b0);
      if (sVar1 != 0) {
        return sVar1;
      }
      in_stack_ffffffffffffffb0 = (HUF_DTable *)0x0;
    }
    local_8 = HUF_decompress4X1_usingDTable_internal_bmi2
                        (in_R8,CONCAT44(in_R9D,in_stack_ffffffffffffffc8),cSrc_00,
                         (size_t)cSrcSize_00,in_stack_ffffffffffffffb0);
  }
  return local_8;
}

Assistant:

HUF_DGEN(HUF_decompress1X1_usingDTable_internal)

static size_t HUF_decompress4X1_usingDTable_internal(void* dst, size_t dstSize, void const* cSrc,
                    size_t cSrcSize, HUF_DTable const* DTable, int flags)
{
    HUF_DecompressUsingDTableFn fallbackFn = HUF_decompress4X1_usingDTable_internal_default;
    HUF_DecompressFastLoopFn loopFn = HUF_decompress4X1_usingDTable_internal_fast_c_loop;

#if DYNAMIC_BMI2
    if (flags & HUF_flags_bmi2) {
        fallbackFn = HUF_decompress4X1_usingDTable_internal_bmi2;
# if ZSTD_ENABLE_ASM_X86_64_BMI2
        if (!(flags & HUF_flags_disableAsm)) {
            loopFn = HUF_decompress4X1_usingDTable_internal_fast_asm_loop;
        }
# endif
    } else {
        return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
    }
#endif

#if ZSTD_ENABLE_ASM_X86_64_BMI2 && defined(__BMI2__)
    if (!(flags & HUF_flags_disableAsm)) {
        loopFn = HUF_decompress4X1_usingDTable_internal_fast_asm_loop;
    }
#endif

    if (!(flags & HUF_flags_disableFast)) {
        size_t const ret = HUF_decompress4X1_usingDTable_internal_fast(dst, dstSize, cSrc, cSrcSize, DTable, loopFn);
        if (ret != 0)
            return ret;
    }
    return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
}